

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O1

void NJDNode_set_pos_group3(NJDNode *node,char *str)

{
  char *pcVar1;
  
  if (node->pos_group3 != (char *)0x0) {
    free(node->pos_group3);
  }
  if ((str == (char *)0x0) || (*str == '\0')) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = strdup(str);
  }
  node->pos_group3 = pcVar1;
  return;
}

Assistant:

void NJDNode_set_pos_group3(NJDNode * node, const char *str)
{
   if (node->pos_group3 != NULL)
      free(node->pos_group3);
   if (str == NULL || strlen(str) == 0)
      node->pos_group3 = NULL;
   else
      node->pos_group3 = strdup(str);
}